

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

bool cmCTestScriptHandler::WriteInitialCache(string *directory,string *text)

{
  uint uVar1;
  string cacheFile;
  cmGeneratedFileStream fout;
  string local_2d0;
  cmAlphaNum local_2b0;
  undefined1 local_280 [32];
  uint auStack_260 [146];
  
  local_280._8_8_ = (directory->_M_dataplus)._M_p;
  local_280._0_8_ = directory->_M_string_length;
  local_2b0.View_._M_len = 0xf;
  local_2b0.View_._M_str = "/CMakeCache.txt";
  cmStrCat<>(&local_2d0,(cmAlphaNum *)local_280,&local_2b0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2d0,false,None);
  uVar1 = *(uint *)((long)auStack_260 + (long)*(_func_int **)(local_280._0_8_ + -0x18));
  if ((uVar1 & 5) == 0) {
    std::ostream::write(local_280,(long)(text->_M_dataplus)._M_p);
    std::ostream::flush();
    std::ofstream::close();
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  std::__cxx11::string::~string((string *)&local_2d0);
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmCTestScriptHandler::WriteInitialCache(const std::string& directory,
                                             const std::string& text)
{
  std::string cacheFile = cmStrCat(directory, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  if (!fout) {
    return false;
  }

  fout.write(text.data(), text.size());

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();
  fout.close();
  return true;
}